

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

uint ct_lt_mpi_uint(mbedtls_mpi_uint x,mbedtls_mpi_uint y)

{
  uint uVar1;
  uint uVar2;
  mbedtls_mpi_uint cond;
  mbedtls_mpi_uint ret;
  mbedtls_mpi_uint y_local;
  mbedtls_mpi_uint x_local;
  
  uVar2 = (uint)(y >> 0x20);
  uVar1 = (uint)(x >> 0x20) ^ uVar2;
  return (uVar2 & uVar1 | (uint)(x - y >> 0x20) & (uVar1 ^ 0xffffffff)) >> 0x1f;
}

Assistant:

static unsigned ct_lt_mpi_uint( const mbedtls_mpi_uint x,
        const mbedtls_mpi_uint y )
{
    mbedtls_mpi_uint ret;
    mbedtls_mpi_uint cond;

    /*
     * Check if the most significant bits (MSB) of the operands are different.
     */
    cond = ( x ^ y );
    /*
     * If the MSB are the same then the difference x-y will be negative (and
     * have its MSB set to 1 during conversion to unsigned) if and only if x<y.
     */
    ret = ( x - y ) & ~cond;
    /*
     * If the MSB are different, then the operand with the MSB of 1 is the
     * bigger. (That is if y has MSB of 1, then x<y is true and it is false if
     * the MSB of y is 0.)
     */
    ret |= y & cond;


    ret = ret >> ( biL - 1 );

    return (unsigned) ret;
}